

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

StringConvertResult
absl::lts_20250127::str_format_internal::FormatConvertImpl
          (longdouble v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  FormatConversionSpecImpl local_10;
  
  local_10.precision_ = conv.precision_;
  local_10._0_8_ = conv._0_8_;
  if (conv.conv_ == v) {
    local_10._1_7_ = conv._1_7_;
    local_10.conv_ = g;
  }
  else if ((conv.conv_ & ~X) != f) {
    return (StringConvertResult)false;
  }
  bVar1 = ConvertFloatImpl(v,&local_10,sink);
  return (StringConvertResult)bVar1;
}

Assistant:

FloatingConvertResult FormatConvertImpl(long double v,
                                        const FormatConversionSpecImpl conv,
                                        FormatSinkImpl *sink) {
  return {ConvertFloatArg(v, conv, sink)};
}